

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O2

void __thiscall Salsa20Cipher::setIv(Salsa20Cipher *this,uint8_t *iv)

{
  if (iv == (uint8_t *)0x0) {
    (this->m_state)._M_elems[6] = 0;
    (this->m_state)._M_elems[7] = 0;
  }
  else {
    bytesToUint(iv,(this->m_state)._M_elems + 6);
    bytesToUint(iv + 4,(this->m_state)._M_elems + 7);
  }
  (this->m_state)._M_elems[8] = 0;
  (this->m_state)._M_elems[9] = 0;
  return;
}

Assistant:

void setIv(const uint8_t* iv)
	{
		if (iv) {
			const auto sz = sizeof(uint32_t);
			
			bytesToUint(iv + 0 * sz, m_state[6]);
			bytesToUint(iv + 1 * sz, m_state[7]);
			
			m_state[8] = m_state[9] = 0;
		} else {
			m_state[6] = m_state[7] = m_state[8] = m_state[9] = 0;
		}
	}